

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::timestamp_t,duckdb::DatePart::DecadeOperator,long>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  reference pvVar4;
  timestamp_t input;
  timestamp_t input_00;
  BaseStatistics result;
  date_t in_stack_ffffffffffffff1c;
  Value local_e0;
  LogicalType local_a0;
  BaseStatistics local_88;
  
  pvVar4 = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  bVar1 = NumericStats::HasMinMax(pvVar4);
  if (bVar1) {
    input = NumericStats::GetMin<duckdb::timestamp_t>(pvVar4);
    input_00 = NumericStats::GetMax<duckdb::timestamp_t>(pvVar4);
    if (((input.value <= input_00.value) &&
        (bVar1 = Value::IsFinite<duckdb::timestamp_t>(input), bVar1)) &&
       (bVar1 = Value::IsFinite<duckdb::timestamp_t>(input_00), bVar1)) {
      Timestamp::GetDate(input);
      iVar2 = Date::ExtractYear(in_stack_ffffffffffffff1c);
      Timestamp::GetDate(input_00);
      iVar3 = Date::ExtractYear(in_stack_ffffffffffffff1c);
      LogicalType::LogicalType(&local_a0,stats_type);
      NumericStats::CreateEmpty(&local_88,&local_a0);
      LogicalType::~LogicalType(&local_a0);
      Value::Value(&local_e0,(long)(iVar2 / 10));
      NumericStats::SetMin(&local_88,&local_e0);
      Value::~Value(&local_e0);
      Value::Value(&local_e0,(long)(iVar3 / 10));
      NumericStats::SetMax(&local_88,&local_e0);
      Value::~Value(&local_e0);
      pvVar4 = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
      BaseStatistics::CopyValidity(&local_88,pvVar4);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&local_88);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}